

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int luaL_checkoption(lua_State *L,int idx,char *def,char **lst)

{
  int iVar1;
  char *__s2;
  lua_State *in_RCX;
  char *in_RDX;
  uint in_ESI;
  lua_State *in_RDI;
  char *s;
  ptrdiff_t i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  size_t *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  long lVar2;
  
  __s2 = lua_tolstring(in_RCX,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                       in_stack_ffffffffffffffd0);
  if ((__s2 == (char *)0x0) && (__s2 = in_RDX, in_RDX == (char *)0x0)) {
    lj_err_argt((lua_State *)0x0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  lVar2 = 0;
  while( true ) {
    if (*(long *)(&in_RCX->nextgc + lVar2 * 2) == 0) {
      lj_err_argv(in_RDI,(int)(ulong)in_ESI,LJ_ERR_INVOPTM,__s2);
    }
    iVar1 = strcmp(*(char **)(&in_RCX->nextgc + lVar2 * 2),__s2);
    if (iVar1 == 0) break;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

LUALIB_API int luaL_checkoption(lua_State *L, int idx, const char *def,
				const char *const lst[])
{
  ptrdiff_t i;
  const char *s = lua_tolstring(L, idx, NULL);
  if (s == NULL && (s = def) == NULL)
    lj_err_argt(L, idx, LUA_TSTRING);
  for (i = 0; lst[i]; i++)
    if (strcmp(lst[i], s) == 0)
      return (int)i;
  lj_err_argv(L, idx, LJ_ERR_INVOPTM, s);
}